

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void xmlParseEndTag2(xmlParserCtxtPtr ctxt,xmlStartTag *tag)

{
  int iVar1;
  xmlChar *pxVar2;
  byte *other;
  endElementNsSAX2Func p_Var3;
  int *piVar4;
  xmlParserInputPtr pxVar5;
  byte *pbVar6;
  int *piVar7;
  byte *pbVar8;
  byte bVar9;
  byte *pbVar10;
  byte bVar11;
  byte *pbVar12;
  xmlHashedString xVar13;
  xmlHashedString p;
  
  pxVar5 = ctxt->input;
  if (((pxVar5->flags & 0x40) == 0) && ((long)pxVar5->end - (long)pxVar5->cur < 0xfa)) {
    xmlParserGrow(ctxt);
    pxVar5 = ctxt->input;
  }
  pxVar2 = pxVar5->cur;
  if ((*pxVar2 != '<') || (pxVar2[1] != '/')) {
    xmlFatalErr(ctxt,XML_ERR_LTSLASH_REQUIRED,(char *)0x0);
    return;
  }
  pxVar5->cur = pxVar2 + 2;
  pxVar5->col = pxVar5->col + 2;
  if (pxVar2[2] == '\0') {
    xmlParserGrow(ctxt);
  }
  pbVar12 = tag->prefix;
  other = ctxt->name;
  if (pbVar12 == (byte *)0x0) {
    pbVar6 = xmlParseNameAndCompare(ctxt,other);
    goto LAB_001415b8;
  }
  pxVar5 = ctxt->input;
  if (((pxVar5->flags & 0x40) == 0) && ((long)pxVar5->end - (long)pxVar5->cur < 0xfa)) {
    xmlParserGrow(ctxt);
    pxVar5 = ctxt->input;
  }
  pbVar6 = pxVar5->cur;
  bVar9 = *pbVar6;
  pbVar10 = pbVar12;
  pbVar8 = pbVar6;
  while (bVar9 != 0) {
    pbVar8 = pbVar8 + 1;
    if (bVar9 != *pbVar10) {
      if (bVar9 == 0x3a && *pbVar10 == 0) {
        bVar9 = *pbVar8;
        pbVar10 = other;
        goto LAB_00141565;
      }
      break;
    }
    pbVar10 = pbVar10 + 1;
    bVar9 = *pbVar8;
  }
  goto LAB_0014158c;
LAB_00141565:
  if (bVar9 == 0) goto LAB_0014157e;
  bVar11 = *pbVar10;
  if (bVar9 != bVar11) goto LAB_00141583;
  pbVar10 = pbVar10 + 1;
  bVar9 = pbVar8[1];
  pbVar8 = pbVar8 + 1;
  goto LAB_00141565;
LAB_0014157e:
  bVar11 = *pbVar10;
  bVar9 = 0;
LAB_00141583:
  if (((bVar11 == 0) && (bVar9 < 0x3f)) && ((0x4000000100002600U >> ((ulong)bVar9 & 0x3f) & 1) != 0)
     ) {
    pxVar5->col = pxVar5->col + ((int)pbVar8 - (int)pbVar6);
    pxVar5->cur = pbVar8;
    pbVar6 = &DAT_00000001;
    goto LAB_001415b8;
  }
LAB_0014158c:
  xVar13 = xmlParseQNameHashed(ctxt,&p);
  pbVar10 = xVar13.name;
  if (pbVar10 == (byte *)0x0) {
    pbVar6 = (byte *)0x0;
  }
  else {
    pbVar6 = &DAT_00000001;
    if (pbVar12 != p.name || other != pbVar10) {
      pbVar6 = pbVar10;
    }
  }
LAB_001415b8:
  pxVar5 = ctxt->input;
  if (((pxVar5->flags & 0x40) == 0) && ((long)pxVar5->end - (long)pxVar5->cur < 0xfa)) {
    xmlParserGrow(ctxt);
  }
  xmlSkipBlankChars(ctxt);
  pxVar5 = ctxt->input;
  pxVar2 = pxVar5->cur;
  if (*pxVar2 == '>') {
    pxVar5->col = pxVar5->col + 1;
    pxVar5->cur = pxVar2 + 1;
    if (pxVar2[1] == '\0') {
      xmlParserGrow(ctxt);
    }
  }
  else {
    xmlFatalErr(ctxt,XML_ERR_GT_REQUIRED,(char *)0x0);
  }
  if (pbVar6 != &DAT_00000001) {
    pbVar12 = (byte *)"unparsable";
    if (pbVar6 != (byte *)0x0) {
      pbVar12 = pbVar6;
    }
    xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_TAG_NAME_MISMATCH,XML_ERR_FATAL,
               ctxt->name,pbVar12,(xmlChar *)0x0,tag->line,
               "Opening and ending tag mismatch: %s line %d and %s\n",ctxt->name,
               (ulong)(uint)tag->line,pbVar12);
  }
  if (((ctxt->sax != (_xmlSAXHandler *)0x0) &&
      (p_Var3 = ctxt->sax->endElementNs, p_Var3 != (endElementNsSAX2Func)0x0)) &&
     (ctxt->disableSAX == 0)) {
    (*p_Var3)(ctxt->userData,ctxt->name,tag->prefix,tag->URI);
  }
  iVar1 = ctxt->spaceNr;
  if (0 < (long)iVar1) {
    ctxt->spaceNr = iVar1 - 1U;
    piVar4 = ctxt->spaceTab;
    piVar7 = piVar4 + (long)iVar1 + -2;
    if (iVar1 == 1) {
      piVar7 = piVar4;
    }
    ctxt->space = piVar7;
    piVar4[iVar1 - 1U] = -1;
  }
  if (tag->nsNr != 0) {
    xmlParserNsPop(ctxt,tag->nsNr);
    return;
  }
  return;
}

Assistant:

static void
xmlParseEndTag2(xmlParserCtxtPtr ctxt, const xmlStartTag *tag) {
    const xmlChar *name;

    GROW;
    if ((RAW != '<') || (NXT(1) != '/')) {
	xmlFatalErr(ctxt, XML_ERR_LTSLASH_REQUIRED, NULL);
	return;
    }
    SKIP(2);

    if (tag->prefix == NULL)
        name = xmlParseNameAndCompare(ctxt, ctxt->name);
    else
        name = xmlParseQNameAndCompare(ctxt, ctxt->name, tag->prefix);

    /*
     * We should definitely be at the ending "S? '>'" part
     */
    GROW;
    SKIP_BLANKS;
    if ((!IS_BYTE_CHAR(RAW)) || (RAW != '>')) {
	xmlFatalErr(ctxt, XML_ERR_GT_REQUIRED, NULL);
    } else
	NEXT1;

    /*
     * [ WFC: Element Type Match ]
     * The Name in an element's end-tag must match the element type in the
     * start-tag.
     *
     */
    if (name != (xmlChar*)1) {
        if (name == NULL) name = BAD_CAST "unparsable";
        xmlFatalErrMsgStrIntStr(ctxt, XML_ERR_TAG_NAME_MISMATCH,
		     "Opening and ending tag mismatch: %s line %d and %s\n",
		                ctxt->name, tag->line, name);
    }

    /*
     * SAX: End of Tag
     */
    if ((ctxt->sax != NULL) && (ctxt->sax->endElementNs != NULL) &&
	(!ctxt->disableSAX))
	ctxt->sax->endElementNs(ctxt->userData, ctxt->name, tag->prefix,
                                tag->URI);

    spacePop(ctxt);
    if (tag->nsNr != 0)
	xmlParserNsPop(ctxt, tag->nsNr);
}